

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenMemoryInitSetSegment(BinaryenExpressionRef expr,char *segment)

{
  bool bVar1;
  Name local_30;
  BinaryenExpressionRef local_20;
  Expression *expression;
  char *segment_local;
  BinaryenExpressionRef expr_local;
  
  local_20 = expr;
  expression = (Expression *)segment;
  segment_local = (char *)expr;
  bVar1 = wasm::Expression::is<wasm::MemoryInit>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<MemoryInit>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xd8f,"void BinaryenMemoryInitSetSegment(BinaryenExpressionRef, const char *)");
  }
  wasm::Name::Name(&local_30,(char *)expression);
  wasm::Name::operator=((Name *)(local_20 + 1),&local_30);
  return;
}

Assistant:

void BinaryenMemoryInitSetSegment(BinaryenExpressionRef expr,
                                  const char* segment) {
  auto* expression = (Expression*)expr;
  assert(expression->is<MemoryInit>());
  static_cast<MemoryInit*>(expression)->segment = Name(segment);
}